

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O2

int ON_String::MapStringOrdinal
              (ON_StringMapOrdinalType map_type,char *string,int element_count,char *mapped_string,
              int mapped_string_capacity)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar4;
  byte bVar5;
  ulong uVar3;
  
  uVar3 = (ulong)(uint)element_count;
  if (mapped_string_capacity == 0) {
    if (-1 < element_count) {
      return element_count;
    }
  }
  else {
    if (mapped_string_capacity < 1 || mapped_string == (char *)0x0) {
      return 0;
    }
    if (string != mapped_string) {
      *mapped_string = '\0';
    }
    if (-1 < element_count) goto LAB_005c4c2b;
  }
  uVar2 = Length(string);
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 0) {
    return 0;
  }
  if (mapped_string_capacity == 0) {
    return uVar2 + 1;
  }
LAB_005c4c2b:
  uVar2 = (uint)uVar3;
  if ((uint)mapped_string_capacity < uVar2) {
    return 0;
  }
  pbVar4 = (byte *)(string + uVar3);
  if ((map_type == UpperOrdinal) || (map_type == MinimumOrdinal)) {
    while (string < pbVar4) {
      bVar1 = *string;
      string = (char *)((byte *)string + 1);
      bVar5 = bVar1 - 0x20;
      if (0x19 < (byte)(bVar1 + 0x9f)) {
        bVar5 = bVar1;
      }
      *mapped_string = bVar5;
      mapped_string = (char *)((byte *)mapped_string + 1);
    }
  }
  else if (map_type == LowerOrdinal) {
    while (string < pbVar4) {
      bVar1 = *string;
      string = (char *)((byte *)string + 1);
      bVar5 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar5 = bVar1;
      }
      *mapped_string = bVar5;
      mapped_string = (char *)((byte *)mapped_string + 1);
    }
  }
  else {
    for (; string < pbVar4; string = (char *)((byte *)string + 1)) {
      *mapped_string = *string;
      mapped_string = (char *)((byte *)mapped_string + 1);
    }
  }
  if ((int)uVar2 < mapped_string_capacity) {
    *mapped_string = 0;
    return uVar2;
  }
  return uVar2;
}

Assistant:

int ON_String::MapStringOrdinal(
  ON_StringMapOrdinalType map_type,
  const char* string,
  int element_count,
  char* mapped_string,
  int mapped_string_capacity
  )
{
  if (0 != mapped_string_capacity)
  {
    if (nullptr == mapped_string || mapped_string_capacity <= 0)
      return 0;

    if (string != mapped_string)
      mapped_string[0] = 0;
  }

  if (element_count < 0)
  {
    element_count = ON_String::Length(string);
    if (element_count < 0)
      return 0;
    if ( 0 == mapped_string_capacity )
      return element_count+1; // +1 for null terminator
  }
  else if ( 0 == mapped_string_capacity )
    return element_count; // no +1 here

  if ( element_count > mapped_string_capacity )
    return 0;

  char c;
  const char* s1 = string + element_count;
  switch (map_type)
  {
  case ON_StringMapOrdinalType::UpperOrdinal:
  case ON_StringMapOrdinalType::MinimumOrdinal:
    while (string < s1)
    {
      c = *string++;
      if (c >= 'a' && c <= 'z')
        c -= 0x20;
      *mapped_string++ = c;
    }
    break;

  case ON_StringMapOrdinalType::LowerOrdinal:
    while (string < s1)
    {
      c = *string++;
      if (c >= 'A' && c <= 'Z')
        c += 0x20;
      *mapped_string++ = c;
    }
    break;

  default:
    while (string < s1)
      *mapped_string++ = *string++;
    break;
  }

  if ( element_count < mapped_string_capacity )
    *mapped_string = 0;

  return element_count;
}